

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlAttrPtr xmlNewProp(xmlNodePtr node,xmlChar *name,xmlChar *value)

{
  xmlAttrPtr pxVar1;
  
  if (name != (xmlChar *)0x0) {
    pxVar1 = xmlNewPropInternal(node,(xmlNsPtr)0x0,name,value,0);
    return pxVar1;
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

xmlAttrPtr
xmlNewProp(xmlNodePtr node, const xmlChar *name, const xmlChar *value) {

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewProp : name == NULL\n");
#endif
	return(NULL);
    }

	return xmlNewPropInternal(node, NULL, name, value, 0);
}